

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsettings.cpp
# Opt level: O3

UBool __thiscall
icu_63::CollationSettings::operator==(CollationSettings *this,CollationSettings *other)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((this->options == other->options) &&
     (((this->options & 0xcU) == 0 || (this->variableTop == other->variableTop)))) {
    uVar1 = this->reorderCodesLength;
    if (uVar1 == other->reorderCodesLength) {
      if ((int)uVar1 < 1) {
        return '\x01';
      }
      if (*this->reorderCodes == *other->reorderCodes) {
        uVar2 = 1;
        do {
          uVar3 = uVar2;
          if (uVar1 == uVar3) break;
          uVar2 = uVar3 + 1;
        } while (this->reorderCodes[uVar3] == other->reorderCodes[uVar3]);
        return uVar1 <= uVar3;
      }
    }
  }
  return '\0';
}

Assistant:

UBool
CollationSettings::operator==(const CollationSettings &other) const {
    if(options != other.options) { return FALSE; }
    if((options & ALTERNATE_MASK) != 0 && variableTop != other.variableTop) { return FALSE; }
    if(reorderCodesLength != other.reorderCodesLength) { return FALSE; }
    for(int32_t i = 0; i < reorderCodesLength; ++i) {
        if(reorderCodes[i] != other.reorderCodes[i]) { return FALSE; }
    }
    return TRUE;
}